

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Snapshot::SetDirectoryDefinitions(Snapshot *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"CMAKE_SOURCE_DIR",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,(this->State->SourceDirectory)._M_dataplus._M_p,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CMAKE_CURRENT_SOURCE_DIR",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,(this->State->SourceDirectory)._M_dataplus._M_p,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CMAKE_BINARY_DIR",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,(this->State->BinaryDirectory)._M_dataplus._M_p,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"CMAKE_CURRENT_BINARY_DIR",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,(this->State->BinaryDirectory)._M_dataplus._M_p,&local_4a);
  SetDefinition(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmState::Snapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR",
                      this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}